

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_local;
  
  *(undefined ***)this = &PTR_grow_002c9418;
  deallocate(this);
  internal::basic_buffer<char>::~basic_buffer((basic_buffer<char> *)this);
  std::allocator<char>::~allocator(&this->super_allocator<char>);
  return;
}

Assistant:

~basic_memory_buffer() { deallocate(); }